

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O3

void __thiscall TTD::ThreadContextTTD::ClearLocalRootsAndRefreshMap_Replay(ThreadContextTTD *this)

{
  BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  Type *pTVar1;
  uint uVar2;
  Type piVar3;
  unsigned_long uVar4;
  DictionaryStats *pDVar5;
  uint uVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  Type pSVar10;
  BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_01;
  uint uVar11;
  ulong uVar12;
  Type pSVar13;
  SimpleHashedEntry<Memory::WriteBarrierPtr<Js::RecyclableObject>,_Memory::WriteBarrierPtr<Js::RecyclableObject>_>
  *pSVar14;
  int nextIndex;
  undefined1 auStack_98 [8];
  BaseHashSet<Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  image;
  uint local_44;
  int lastIndex;
  
  auStack_98 = (undefined1  [8])0x0;
  image.
  super_BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .buckets = (Type)0x0;
  image.
  super_BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .entries = (Type)&Memory::HeapAllocator::Instance;
  image.
  super_BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .alloc = (Type)0x0;
  image.
  super_BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .size = 0;
  image.
  super_BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .count = 0;
  image.
  super_BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .freeList = 0x4b;
  image.
  super_BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .freeCount = 0;
  image.
  super_BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .modFunctionIndex = 0;
  uVar8 = (this->m_ttdRootTagToObjectMap).bucketCount;
  if (uVar8 != 0) {
    this_00 = &this->m_ttdRootTagToObjectMap;
    uVar12 = 0;
    do {
      uVar11 = this_00->buckets[uVar12];
      if (uVar11 != 0xffffffff) {
        local_44 = 0xffffffff;
        do {
          piVar3 = (this->m_ttdMayBeLongLivedRoot).buckets;
          uVar9 = 0;
          if (piVar3 != (Type)0x0) {
            pSVar13 = (this->m_ttdRootTagToObjectMap).entries + (int)uVar11;
            uVar4 = (pSVar13->
                    super_DefaultHashedEntry<unsigned_long,_Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    ).super_KeyValueEntry<unsigned_long,_Js::RecyclableObject_*>.
                    super_ValueEntry<Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>_>
                    .super_KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>.key;
            uVar9 = JsUtil::
                    BaseDictionary<unsigned_long,_bool,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    ::GetBucket(((uint)(uVar4 >> 0x20) ^ (uint)uVar4) * 2 + 1,
                                (this->m_ttdMayBeLongLivedRoot).bucketCount,
                                (this->m_ttdMayBeLongLivedRoot).modFunctionIndex);
            uVar8 = piVar3[uVar9];
            uVar9 = 0;
            if (-1 < (int)uVar8) {
              pSVar10 = (this->m_ttdMayBeLongLivedRoot).entries;
              uVar9 = 0;
              do {
                if (pSVar10[uVar8].
                    super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .super_KeyValueEntry<unsigned_long,_bool>.
                    super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
                    .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.key ==
                    (pSVar13->
                    super_DefaultHashedEntry<unsigned_long,_Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    ).super_KeyValueEntry<unsigned_long,_Js::RecyclableObject_*>.
                    super_ValueEntry<Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>_>
                    .super_KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>.key) {
                  pDVar5 = (this->m_ttdMayBeLongLivedRoot).stats;
                  if (pDVar5 != (DictionaryStats *)0x0) {
                    DictionaryStats::Lookup(pDVar5,uVar9);
                    pSVar10 = (this->m_ttdMayBeLongLivedRoot).entries;
                  }
                  if ((pSVar10[uVar8].
                       super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                       .super_KeyValueEntry<unsigned_long,_bool>.
                       super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
                       .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.value & 1U) == 0)
                  goto LAB_008f3a0d;
                  image.
                  super_BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  .stats = (Type)(pSVar13->
                                 super_DefaultHashedEntry<unsigned_long,_Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                 ).super_KeyValueEntry<unsigned_long,_Js::RecyclableObject_*>.
                                 super_ValueEntry<Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>_>
                                 .
                                 super_KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>
                                 .value;
                  JsUtil::
                  BaseDictionary<Js::RecyclableObject*,Js::RecyclableObject*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                  ::
                  Insert<(JsUtil::BaseDictionary<Js::RecyclableObject*,Js::RecyclableObject*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                            ((BaseDictionary<Js::RecyclableObject*,Js::RecyclableObject*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                              *)auStack_98,
                             (RecyclableObject **)
                             &image.
                              super_BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                              .stats,(RecyclableObject **)pSVar13);
                  local_44 = uVar11;
                  uVar11 = (this->m_ttdRootTagToObjectMap).entries[(int)uVar11].
                           super_DefaultHashedEntry<unsigned_long,_Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                           .super_KeyValueEntry<unsigned_long,_Js::RecyclableObject_*>.
                           super_ValueEntry<Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>_>
                           .super_KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>.
                           next;
                  goto LAB_008f3aac;
                }
                uVar9 = uVar9 + 1;
                uVar8 = pSVar10[uVar8].
                        super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                        .super_KeyValueEntry<unsigned_long,_bool>.
                        super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
                        .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.next;
              } while (-1 < (int)uVar8);
            }
          }
          pDVar5 = (this->m_ttdMayBeLongLivedRoot).stats;
          if (pDVar5 != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(pDVar5,uVar9);
          }
LAB_008f3a0d:
          pSVar13 = (this->m_ttdRootTagToObjectMap).entries;
          uVar8 = pSVar13[(int)uVar11].
                  super_DefaultHashedEntry<unsigned_long,_Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<unsigned_long,_Js::RecyclableObject_*>.
                  super_ValueEntry<Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>_>
                  .super_KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>.next;
          if ((int)local_44 < 0) {
            this_00->buckets[uVar12] = uVar8;
          }
          else {
            pSVar13[local_44].
            super_DefaultHashedEntry<unsigned_long,_Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_long,_Js::RecyclableObject_*>.
            super_ValueEntry<Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>_>
            .super_KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>.next = uVar8;
          }
          pSVar13[(int)uVar11].
          super_DefaultHashedEntry<unsigned_long,_Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          .super_KeyValueEntry<unsigned_long,_Js::RecyclableObject_*>.
          super_ValueEntry<Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>_>
          .super_KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>.value =
               (RecyclableObject *)0x0;
          pSVar13[(int)uVar11].
          super_DefaultHashedEntry<unsigned_long,_Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          .super_KeyValueEntry<unsigned_long,_Js::RecyclableObject_*>.
          super_ValueEntry<Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>_>
          .super_KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>.key = 0;
          JsUtil::
          BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::SetNextFreeEntryIndex
                    (this_00,(this->m_ttdRootTagToObjectMap).entries + (int)uVar11,
                     -(uint)((this->m_ttdRootTagToObjectMap).freeCount == 0) |
                     (this->m_ttdRootTagToObjectMap).freeList);
          (this->m_ttdRootTagToObjectMap).freeList = uVar11;
          pTVar1 = &(this->m_ttdRootTagToObjectMap).freeCount;
          *pTVar1 = *pTVar1 + 1;
          pDVar5 = (this->m_ttdRootTagToObjectMap).stats;
          uVar11 = uVar8;
          if (pDVar5 != (DictionaryStats *)0x0) {
            DictionaryStats::Remove(pDVar5,this_00->buckets[uVar12] == -1);
          }
LAB_008f3aac:
        } while (uVar11 != 0xffffffff);
        uVar8 = (this->m_ttdRootTagToObjectMap).bucketCount;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < uVar8);
  }
  this_01 = &Memory::
             RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
             ::operator->(&this->m_ttdReplayRootPinSet)->
             super_BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ;
  uVar8 = this_01->bucketCount;
  if (uVar8 != 0) {
    uVar12 = 0;
    do {
      uVar11 = (this_01->buckets).ptr[uVar12];
      if (uVar11 != 0xffffffff) {
        uVar8 = 0xffffffff;
        do {
          image.
          super_BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          .stats = (Type)(this_01->entries).ptr[(int)uVar11].
                         super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::RecyclableObject>,_Memory::WriteBarrierPtr<Js::RecyclableObject>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                         .
                         super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::RecyclableObject>,_Memory::WriteBarrierPtr<Js::RecyclableObject>_>
                         .
                         super_ValueEntry<Memory::WriteBarrierPtr<Js::RecyclableObject>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::RecyclableObject>_>_>
                         .super_ValueEntryData<Memory::WriteBarrierPtr<Js::RecyclableObject>_>.value
                         .ptr;
          bVar7 = JsUtil::
                  BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  ::ContainsKey((BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                 *)auStack_98,
                                (RecyclableObject **)
                                &image.
                                 super_BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                 .stats);
          pSVar14 = (this_01->entries).ptr;
          uVar2 = pSVar14[(int)uVar11].
                  super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::RecyclableObject>,_Memory::WriteBarrierPtr<Js::RecyclableObject>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                  .
                  super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::RecyclableObject>,_Memory::WriteBarrierPtr<Js::RecyclableObject>_>
                  .
                  super_ValueEntry<Memory::WriteBarrierPtr<Js::RecyclableObject>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::RecyclableObject>_>_>
                  .super_ValueEntryData<Memory::WriteBarrierPtr<Js::RecyclableObject>_>.next;
          uVar6 = uVar11;
          if (!bVar7) {
            if ((int)uVar8 < 0) {
              (this_01->buckets).ptr[uVar12] = uVar2;
            }
            else {
              pSVar14[uVar8].
              super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::RecyclableObject>,_Memory::WriteBarrierPtr<Js::RecyclableObject>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
              .
              super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::RecyclableObject>,_Memory::WriteBarrierPtr<Js::RecyclableObject>_>
              .
              super_ValueEntry<Memory::WriteBarrierPtr<Js::RecyclableObject>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::RecyclableObject>_>_>
              .super_ValueEntryData<Memory::WriteBarrierPtr<Js::RecyclableObject>_>.next = uVar2;
            }
            pSVar14 = pSVar14 + (int)uVar11;
            Memory::Recycler::WBSetBit((char *)pSVar14);
            (pSVar14->
            super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::RecyclableObject>,_Memory::WriteBarrierPtr<Js::RecyclableObject>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
            ).
            super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::RecyclableObject>,_Memory::WriteBarrierPtr<Js::RecyclableObject>_>
            .
            super_ValueEntry<Memory::WriteBarrierPtr<Js::RecyclableObject>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::RecyclableObject>_>_>
            .super_ValueEntryData<Memory::WriteBarrierPtr<Js::RecyclableObject>_>.value.ptr =
                 (RecyclableObject *)0x0;
            Memory::RecyclerWriteBarrierManager::WriteBarrier(pSVar14);
            JsUtil::
            BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::SetNextFreeEntryIndex
                      (this_01,(this_01->entries).ptr + (int)uVar11,
                       -(uint)(this_01->freeCount == 0) | this_01->freeList);
            this_01->freeList = uVar11;
            this_01->freeCount = this_01->freeCount + 1;
            uVar6 = uVar8;
            if (this_01->stats != (DictionaryStats *)0x0) {
              DictionaryStats::Remove(this_01->stats,(this_01->buckets).ptr[uVar12] == -1);
            }
          }
          uVar11 = uVar2;
          uVar8 = uVar6;
        } while (uVar2 != 0xffffffff);
        uVar8 = this_01->bucketCount;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < uVar8);
  }
  JsUtil::
  BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                     *)auStack_98);
  return;
}

Assistant:

void ThreadContextTTD::ClearLocalRootsAndRefreshMap_Replay()
    {
        JsUtil::BaseHashSet<Js::RecyclableObject*, HeapAllocator> image(&HeapAllocator::Instance);

        this->m_ttdRootTagToObjectMap.MapAndRemoveIf([&](JsUtil::SimpleDictionaryEntry<TTD_LOG_PTR_ID, Js::RecyclableObject*>& entry) -> bool
        {
            bool localonly = !this->m_ttdMayBeLongLivedRoot.LookupWithKey(entry.Key(), false);

            if(!localonly)
            {
                image.AddNew(entry.Value());
            }

            return localonly;
        });

        this->m_ttdReplayRootPinSet->MapAndRemoveIf([&](Js::RecyclableObject* value) -> bool
        {
            return !image.Contains(value);
        });
    }